

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

runtime_type<density::feature_list<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density_tests::feature_call_update>_>
* __thiscall
density::
heter_queue<density::runtime_type<density::feature_list<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density_tests::feature_call_update>_>,_density::basic_default_allocator<65536UL>_>
::consume_operation::complete_type(consume_operation *this)

{
  bool bVar1;
  runtime_type<density::feature_list<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density_tests::feature_call_update>_>
  *prVar2;
  consume_operation *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    density_tests::detail::assert_failed<>("!empty()",anon_var_dwarf_12e55,0x3ee);
  }
  prVar2 = heter_queue<density::runtime_type<density::feature_list<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density_tests::feature_call_update>_>,_density::basic_default_allocator<65536UL>_>
           ::type_after_control(this->m_control);
  return prVar2;
}

Assistant:

const RUNTIME_TYPE & complete_type() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return *type_after_control(m_control);
            }